

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnvhz.cpp
# Opt level: O0

void UConverter_fromUnicode_HZ_OFFSETS_LOGIC(UConverterFromUnicodeArgs *args,UErrorCode *err)

{
  char cVar1;
  char cVar2;
  ushort uVar3;
  long *plVar4;
  undefined8 uVar5;
  bool bVar6;
  uint uVar7;
  undefined1 uVar8;
  undefined1 uVar9;
  int32_t iVar10;
  int iVar11;
  UChar trail;
  char *pcStack_60;
  int32_t length;
  char *escSeq;
  int len;
  UBool oldIsTargetUCharDBCS;
  UBool isTargetUCharDBCS;
  UConverterDataHZ *myConverterData;
  UChar32 mySourceChar;
  uint32_t targetUniChar;
  int32_t mySourceLength;
  int32_t targetLength;
  int32_t myTargetIndex;
  int32_t mySourceIndex;
  int32_t *offsets;
  char *myTarget;
  UChar *mySource;
  UErrorCode *err_local;
  UConverterFromUnicodeArgs *args_local;
  
  myTarget = (char *)args->source;
  offsets = (int32_t *)args->target;
  targetLength = 0;
  mySourceLength = 0;
  targetUniChar = (int)args->targetLimit - (int)offsets;
  mySourceChar = (UChar32)((long)args->sourceLimit - (long)args->source >> 1);
  myConverterData._0_4_ = 0;
  plVar4 = (long *)args->converter->extraInfo;
  escSeq._7_1_ = *(char *)((long)plVar4 + 0x12);
  iVar10 = targetLength;
  _myTargetIndex = args->offsets;
  mySource = (UChar *)err;
  err_local = (UErrorCode *)args;
  if ((args->converter->fromUChar32 == 0) || ((int)targetUniChar < 1)) {
    while (targetLength = iVar10, targetLength < mySourceChar) {
      myConverterData._4_4_ = 0xffff;
      if ((int)targetUniChar <= mySourceLength) {
        mySource[0] = L'\x0f';
        mySource[1] = L'\0';
        break;
      }
      iVar10 = targetLength + 1;
      myConverterData._0_4_ = (uint)*(ushort *)(myTarget + (long)targetLength * 2);
      if ((uint)myConverterData == 0x7e) {
        escSeq._0_4_ = 2;
        pcStack_60 = "~~";
        while (0 < (int)escSeq) {
          if (mySourceLength < (int)targetUniChar) {
            *(char *)(*(undefined8 *)(err_local + 8) + (long)mySourceLength) = *pcStack_60;
            if (*(undefined8 *)(err_local + 0xc) != U_ZERO_ERROR) {
              *_myTargetIndex = targetLength;
              _myTargetIndex = _myTargetIndex + 1;
            }
            mySourceLength = mySourceLength + 1;
          }
          else {
            cVar1 = *pcStack_60;
            uVar5 = *(undefined8 *)(err_local + 2);
            cVar2 = *(char *)(*(undefined8 *)(err_local + 2) + 0x5b);
            *(char *)(*(undefined8 *)(err_local + 2) + 0x5b) = cVar2 + '\x01';
            *(char *)(uVar5 + ~(U_ERROR_WARNING_START|U_STATE_TOO_OLD_ERROR) + (long)(int)cVar2) =
                 cVar1;
            mySource[0] = L'\x0f';
            mySource[1] = L'\0';
          }
          pcStack_60 = pcStack_60 + 1;
          escSeq._0_4_ = (int)escSeq + -1;
        }
      }
      else {
        uVar7 = (uint)myConverterData;
        targetLength = iVar10;
        if (0x7f < (uint)myConverterData) {
          iVar10 = ucnv_MBCSFromUChar32_63
                             (*(UConverterSharedData **)(*plVar4 + 0x30),(uint)myConverterData,
                              (uint32_t *)((long)&myConverterData + 4),
                              *(UBool *)(*(undefined8 *)(err_local + 2) + 0x3f));
          if (((iVar10 == 2) && ((myConverterData._4_4_ - 0xa1a1 & 0xffff) < 0x5c5e)) &&
             ((myConverterData._4_4_ - 0xa1 & 0xff) < 0x5e)) {
            uVar7 = myConverterData._4_4_ - 0x8080;
          }
          else {
            myConverterData._4_4_ = 0xffff;
            uVar7 = myConverterData._4_4_;
          }
        }
        myConverterData._4_4_ = uVar7;
        if (myConverterData._4_4_ == 0xffff) {
          if (((uint)myConverterData & 0xfffff800) != 0xd800) {
            mySource[0] = L'\n';
            mySource[1] = L'\0';
            goto LAB_003882e5;
          }
          if (((uint)myConverterData & 0x400) != 0) {
            mySource[0] = L'\f';
            mySource[1] = L'\0';
            goto LAB_003882e5;
          }
          *(uint *)(*(undefined8 *)(err_local + 2) + 0x54) = (uint)myConverterData;
          goto LAB_0038824b;
        }
        bVar6 = 0xff < myConverterData._4_4_;
        *(bool *)((long)plVar4 + 0x12) = bVar6;
        if (((bool)escSeq._7_1_ != bVar6) || ((char)plVar4[2] == '\0')) {
          if (bVar6) {
            escSeq._0_4_ = 2;
            pcStack_60 = "~{";
            while (0 < (int)escSeq) {
              if (mySourceLength < (int)targetUniChar) {
                *(char *)(*(undefined8 *)(err_local + 8) + (long)mySourceLength) = *pcStack_60;
                if (*(undefined8 *)(err_local + 0xc) != U_ZERO_ERROR) {
                  *_myTargetIndex = targetLength + -1;
                  _myTargetIndex = _myTargetIndex + 1;
                }
                mySourceLength = mySourceLength + 1;
              }
              else {
                cVar1 = *pcStack_60;
                uVar5 = *(undefined8 *)(err_local + 2);
                cVar2 = *(char *)(*(undefined8 *)(err_local + 2) + 0x5b);
                *(char *)(*(undefined8 *)(err_local + 2) + 0x5b) = cVar2 + '\x01';
                *(char *)(uVar5 + ~(U_ERROR_WARNING_START|U_STATE_TOO_OLD_ERROR) + (long)(int)cVar2)
                     = cVar1;
                mySource[0] = L'\x0f';
                mySource[1] = L'\0';
              }
              pcStack_60 = pcStack_60 + 1;
              escSeq._0_4_ = (int)escSeq + -1;
            }
            *(undefined1 *)(plVar4 + 2) = 1;
          }
          else {
            escSeq._0_4_ = 2;
            pcStack_60 = "~}";
            while (0 < (int)escSeq) {
              if (mySourceLength < (int)targetUniChar) {
                *(char *)(*(undefined8 *)(err_local + 8) + (long)mySourceLength) = *pcStack_60;
                if (*(undefined8 *)(err_local + 0xc) != U_ZERO_ERROR) {
                  *_myTargetIndex = targetLength + -1;
                  _myTargetIndex = _myTargetIndex + 1;
                }
                mySourceLength = mySourceLength + 1;
              }
              else {
                cVar1 = *pcStack_60;
                uVar5 = *(undefined8 *)(err_local + 2);
                cVar2 = *(char *)(*(undefined8 *)(err_local + 2) + 0x5b);
                *(char *)(*(undefined8 *)(err_local + 2) + 0x5b) = cVar2 + '\x01';
                *(char *)(uVar5 + ~(U_ERROR_WARNING_START|U_STATE_TOO_OLD_ERROR) + (long)(int)cVar2)
                     = cVar1;
                mySource[0] = L'\x0f';
                mySource[1] = L'\0';
              }
              pcStack_60 = pcStack_60 + 1;
              escSeq._0_4_ = (int)escSeq + -1;
            }
            *(undefined1 *)(plVar4 + 2) = 1;
          }
        }
        uVar8 = (undefined1)myConverterData._4_4_;
        escSeq._7_1_ = bVar6;
        iVar10 = targetLength;
        if (bVar6) {
          uVar9 = (undefined1)(myConverterData._4_4_ >> 8);
          if (mySourceLength < (int)targetUniChar) {
            iVar11 = mySourceLength + 1;
            *(undefined1 *)((long)offsets + (long)mySourceLength) = uVar9;
            if (_myTargetIndex != (int *)0x0) {
              *_myTargetIndex = targetLength + -1;
              _myTargetIndex = _myTargetIndex + 1;
            }
            if (iVar11 < (int)targetUniChar) {
              mySourceLength = mySourceLength + 2;
              *(undefined1 *)((long)offsets + (long)iVar11) = uVar8;
              if (_myTargetIndex != (int *)0x0) {
                *_myTargetIndex = targetLength + -1;
                _myTargetIndex = _myTargetIndex + 1;
              }
            }
            else {
              uVar5 = *(undefined8 *)(err_local + 2);
              cVar1 = *(char *)(*(undefined8 *)(err_local + 2) + 0x5b);
              *(char *)(*(undefined8 *)(err_local + 2) + 0x5b) = cVar1 + '\x01';
              *(undefined1 *)(uVar5 + ~(U_ERROR_WARNING_START|U_STATE_TOO_OLD_ERROR) + (long)cVar1)
                   = uVar8;
              mySource[0] = L'\x0f';
              mySource[1] = L'\0';
              mySourceLength = iVar11;
            }
          }
          else {
            uVar5 = *(undefined8 *)(err_local + 2);
            cVar1 = *(char *)(*(undefined8 *)(err_local + 2) + 0x5b);
            *(char *)(*(undefined8 *)(err_local + 2) + 0x5b) = cVar1 + '\x01';
            *(undefined1 *)(uVar5 + ~(U_ERROR_WARNING_START|U_STATE_TOO_OLD_ERROR) + (long)cVar1) =
                 uVar9;
            uVar5 = *(undefined8 *)(err_local + 2);
            cVar1 = *(char *)(*(undefined8 *)(err_local + 2) + 0x5b);
            *(char *)(*(undefined8 *)(err_local + 2) + 0x5b) = cVar1 + '\x01';
            *(undefined1 *)(uVar5 + ~(U_ERROR_WARNING_START|U_STATE_TOO_OLD_ERROR) + (long)cVar1) =
                 uVar8;
            mySource[0] = L'\x0f';
            mySource[1] = L'\0';
          }
        }
        else if (mySourceLength < (int)targetUniChar) {
          iVar11 = mySourceLength + 1;
          *(undefined1 *)((long)offsets + (long)mySourceLength) = uVar8;
          mySourceLength = iVar11;
          if (_myTargetIndex != (int *)0x0) {
            *_myTargetIndex = targetLength + -1;
            _myTargetIndex = _myTargetIndex + 1;
          }
        }
        else {
          uVar5 = *(undefined8 *)(err_local + 2);
          cVar1 = *(char *)(*(undefined8 *)(err_local + 2) + 0x5b);
          *(char *)(*(undefined8 *)(err_local + 2) + 0x5b) = cVar1 + '\x01';
          *(undefined1 *)(uVar5 + ~(U_ERROR_WARNING_START|U_STATE_TOO_OLD_ERROR) + (long)cVar1) =
               uVar8;
          mySource[0] = L'\x0f';
          mySource[1] = L'\0';
        }
      }
    }
  }
  else {
LAB_0038824b:
    if (targetLength < mySourceChar) {
      uVar3 = *(ushort *)(*(undefined8 *)(err_local + 4) + (long)targetLength * 2);
      if ((uVar3 & 0xfc00) == 0xdc00) {
        targetLength = targetLength + 1;
        myConverterData._0_4_ =
             *(int *)(*(undefined8 *)(err_local + 2) + 0x54) * 0x400 + (uint)uVar3 + 0xfca02400;
        *(undefined4 *)(*(undefined8 *)(err_local + 2) + 0x54) = 0;
        mySource[0] = L'\n';
        mySource[1] = L'\0';
      }
      else {
        mySource[0] = L'\f';
        mySource[1] = L'\0';
      }
    }
    else {
      mySource[0] = L'\0';
      mySource[1] = L'\0';
    }
LAB_003882e5:
    *(uint *)(*(undefined8 *)(err_local + 2) + 0x54) = (uint)myConverterData;
  }
  *(long *)(err_local + 8) = *(undefined8 *)(err_local + 8) + (long)mySourceLength;
  *(long *)(err_local + 4) = *(undefined8 *)(err_local + 4) + (long)targetLength * 2;
  *(char *)((long)plVar4 + 0x12) = escSeq._7_1_;
  return;
}

Assistant:

static void  U_CALLCONV
UConverter_fromUnicode_HZ_OFFSETS_LOGIC (UConverterFromUnicodeArgs * args,
                                                      UErrorCode * err){
    const UChar *mySource = args->source;
    char *myTarget = args->target;
    int32_t* offsets = args->offsets;
    int32_t mySourceIndex = 0;
    int32_t myTargetIndex = 0;
    int32_t targetLength = (int32_t)(args->targetLimit - myTarget);
    int32_t mySourceLength = (int32_t)(args->sourceLimit - args->source);
    uint32_t targetUniChar = 0x0000;
    UChar32 mySourceChar = 0x0000;
    UConverterDataHZ *myConverterData=(UConverterDataHZ*)args->converter->extraInfo;
    UBool isTargetUCharDBCS = (UBool) myConverterData->isTargetUCharDBCS;
    UBool oldIsTargetUCharDBCS;
    int len =0;
    const char* escSeq=NULL;
    
    /* Calling code already handles this situation. */
    /*if ((args->converter == NULL) || (args->targetLimit < myTarget) || (args->sourceLimit < args->source)){
        *err = U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }*/
    if(args->converter->fromUChar32!=0 && myTargetIndex < targetLength) {
        goto getTrail;
    }
    /*writing the char to the output stream */
    while (mySourceIndex < mySourceLength){
        targetUniChar = missingCharMarker;
        if (myTargetIndex < targetLength){
            
            mySourceChar = (UChar) mySource[mySourceIndex++];
            

            oldIsTargetUCharDBCS = isTargetUCharDBCS;
            if(mySourceChar ==UCNV_TILDE){
                /*concatEscape(args, &myTargetIndex, &targetLength,"\x7E\x7E",err,2,&mySourceIndex);*/
                len = ESC_LEN;
                escSeq = TILDE_ESCAPE;
                CONCAT_ESCAPE_MACRO(args, myTargetIndex, targetLength, escSeq,err,len,mySourceIndex);
                continue;
            } else if(mySourceChar <= 0x7f) {
                targetUniChar = mySourceChar;
            } else {
                int32_t length= ucnv_MBCSFromUChar32(myConverterData->gbConverter->sharedData,
                    mySourceChar,&targetUniChar,args->converter->useFallback);
                /* we can only use lead bytes 21..7D and trail bytes 21..7E */
                if( length == 2 &&
                    (uint16_t)(targetUniChar - 0xa1a1) <= (0xfdfe - 0xa1a1) &&
                    (uint8_t)(targetUniChar - 0xa1) <= (0xfe - 0xa1)
                ) {
                    targetUniChar -= 0x8080;
                } else {
                    targetUniChar = missingCharMarker;
                }
            }
            if (targetUniChar != missingCharMarker){
               myConverterData->isTargetUCharDBCS = isTargetUCharDBCS = (UBool)(targetUniChar>0x00FF);     
                 if(oldIsTargetUCharDBCS != isTargetUCharDBCS || !myConverterData->isEscapeAppended ){
                    /*Shifting from a double byte to single byte mode*/
                    if(!isTargetUCharDBCS){
                        len =ESC_LEN;
                        escSeq = SB_ESCAPE;
                        CONCAT_ESCAPE_MACRO(args, myTargetIndex, targetLength, escSeq,err,len,mySourceIndex);
                        myConverterData->isEscapeAppended = TRUE;
                    }
                    else{ /* Shifting from a single byte to double byte mode*/
                        len =ESC_LEN;
                        escSeq = DB_ESCAPE;
                        CONCAT_ESCAPE_MACRO(args, myTargetIndex, targetLength, escSeq,err,len,mySourceIndex);
                        myConverterData->isEscapeAppended = TRUE;
                        
                    }
                }
            
                if(isTargetUCharDBCS){
                    if( myTargetIndex <targetLength){
                        myTarget[myTargetIndex++] =(char) (targetUniChar >> 8);
                        if(offsets){
                            *(offsets++) = mySourceIndex-1;
                        }
                        if(myTargetIndex < targetLength){
                            myTarget[myTargetIndex++] =(char) targetUniChar;
                            if(offsets){
                                *(offsets++) = mySourceIndex-1;
                            }
                        }else{
                            args->converter->charErrorBuffer[args->converter->charErrorBufferLength++] = (char) targetUniChar;
                            *err = U_BUFFER_OVERFLOW_ERROR;
                        } 
                    }else{
                        args->converter->charErrorBuffer[args->converter->charErrorBufferLength++] =(char) (targetUniChar >> 8);
                        args->converter->charErrorBuffer[args->converter->charErrorBufferLength++] = (char) targetUniChar;
                        *err = U_BUFFER_OVERFLOW_ERROR;
                    }

                }else{
                    if( myTargetIndex <targetLength){
                        myTarget[myTargetIndex++] = (char) (targetUniChar );
                        if(offsets){
                            *(offsets++) = mySourceIndex-1;
                        }
                        
                    }else{
                        args->converter->charErrorBuffer[args->converter->charErrorBufferLength++] = (char) targetUniChar;
                        *err = U_BUFFER_OVERFLOW_ERROR;
                    }
                }

            }
            else{
                /* oops.. the code point is unassigned */
                /*Handle surrogates */
                /*check if the char is a First surrogate*/
                if(U16_IS_SURROGATE(mySourceChar)) {
                    if(U16_IS_SURROGATE_LEAD(mySourceChar)) {
                        args->converter->fromUChar32=mySourceChar;
getTrail:
                        /*look ahead to find the trail surrogate*/
                        if(mySourceIndex <  mySourceLength) {
                            /* test the following code unit */
                            UChar trail=(UChar) args->source[mySourceIndex];
                            if(U16_IS_TRAIL(trail)) {
                                ++mySourceIndex;
                                mySourceChar=U16_GET_SUPPLEMENTARY(args->converter->fromUChar32, trail);
                                args->converter->fromUChar32=0x00;
                                /* there are no surrogates in GB2312*/
                                *err = U_INVALID_CHAR_FOUND;
                                /* exit this condition tree */
                            } else {
                                /* this is an unmatched lead code unit (1st surrogate) */
                                /* callback(illegal) */
                                *err=U_ILLEGAL_CHAR_FOUND;
                            }
                        } else {
                            /* no more input */
                            *err = U_ZERO_ERROR;
                        }
                    } else {
                        /* this is an unmatched trail code unit (2nd surrogate) */
                        /* callback(illegal) */
                        *err=U_ILLEGAL_CHAR_FOUND;
                    }
                } else {
                    /* callback(unassigned) for a BMP code point */
                    *err = U_INVALID_CHAR_FOUND;
                }

                args->converter->fromUChar32=mySourceChar;
                break;
            }
        }
        else{
            *err = U_BUFFER_OVERFLOW_ERROR;
            break;
        }
        targetUniChar=missingCharMarker;
    }

    args->target += myTargetIndex;
    args->source += mySourceIndex;
    myConverterData->isTargetUCharDBCS = isTargetUCharDBCS;
}